

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

void openjtalk_setAdditionalHalfTone(OpenJTalk *oj,double f)

{
  if (oj != (OpenJTalk *)0x0) {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    oj->additional_half_tone = f;
    Open_JTalk_set_additional_half_tone(oj->open_jtalk,f);
    return;
  }
  g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setAdditionalHalfTone(OpenJTalk *oj, double f)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	oj->additional_half_tone = f;
	Open_JTalk_set_additional_half_tone(oj->open_jtalk, oj->additional_half_tone);
}